

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O3

int __thiscall ncnn::BatchNorm::load_model(BatchNorm *this,ModelBin *mb)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  float fVar13;
  void *local_70;
  int *local_68;
  size_t local_60;
  int local_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  size_t local_30;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels,1);
  if (&this->slope_data != (Mat *)&local_70) {
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + 1;
      UNLOCK();
    }
    piVar2 = (this->slope_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->slope_data).data;
        pAVar4 = (this->slope_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->slope_data).data = local_70;
    (this->slope_data).refcount = local_68;
    (this->slope_data).elemsize = local_60;
    (this->slope_data).elempack = local_58;
    (this->slope_data).allocator = local_50;
    (this->slope_data).dims = local_48;
    (this->slope_data).w = iStack_44;
    (this->slope_data).h = iStack_40;
    (this->slope_data).d = iStack_3c;
    (this->slope_data).c = local_38;
    (this->slope_data).cstep = local_30;
  }
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      if (local_50 == (Allocator *)0x0) {
        if (local_70 != (void *)0x0) {
          free(local_70);
        }
      }
      else {
        (*local_50->_vptr_Allocator[3])();
      }
    }
  }
  iVar11 = -100;
  if (((this->slope_data).data != (void *)0x0) &&
     ((long)(this->slope_data).c * (this->slope_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels,1);
    if (&this->mean_data != (Mat *)&local_70) {
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + 1;
        UNLOCK();
      }
      piVar2 = (this->mean_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->mean_data).data;
          pAVar4 = (this->mean_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->mean_data).data = local_70;
      (this->mean_data).refcount = local_68;
      (this->mean_data).elemsize = local_60;
      (this->mean_data).elempack = local_58;
      (this->mean_data).allocator = local_50;
      (this->mean_data).dims = local_48;
      (this->mean_data).w = iStack_44;
      (this->mean_data).h = iStack_40;
      (this->mean_data).d = iStack_3c;
      (this->mean_data).c = local_38;
      (this->mean_data).cstep = local_30;
    }
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + -1;
      UNLOCK();
      if (*local_68 == 0) {
        if (local_50 == (Allocator *)0x0) {
          if (local_70 != (void *)0x0) {
            free(local_70);
          }
        }
        else {
          (*local_50->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->mean_data).data != (void *)0x0) &&
       ((long)(this->mean_data).c * (this->mean_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels,1);
      if (&this->var_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar2 = (this->var_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->var_data).data;
            pAVar4 = (this->var_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->var_data).data = local_70;
        (this->var_data).refcount = local_68;
        (this->var_data).elemsize = local_60;
        (this->var_data).elempack = local_58;
        (this->var_data).allocator = local_50;
        (this->var_data).dims = local_48;
        (this->var_data).w = iStack_44;
        (this->var_data).h = iStack_40;
        (this->var_data).d = iStack_3c;
        (this->var_data).c = local_38;
        (this->var_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            if (local_70 != (void *)0x0) {
              free(local_70);
            }
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      if (((this->var_data).data != (void *)0x0) &&
         ((long)(this->var_data).c * (this->var_data).cstep != 0)) {
        (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels);
        if (&this->bias_data != (Mat *)&local_70) {
          if (local_68 != (int *)0x0) {
            LOCK();
            *local_68 = *local_68 + 1;
            UNLOCK();
          }
          piVar2 = (this->bias_data).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = (this->bias_data).data;
              pAVar4 = (this->bias_data).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          (this->bias_data).data = local_70;
          (this->bias_data).refcount = local_68;
          (this->bias_data).elemsize = local_60;
          (this->bias_data).elempack = local_58;
          (this->bias_data).allocator = local_50;
          (this->bias_data).dims = local_48;
          (this->bias_data).w = iStack_44;
          (this->bias_data).h = iStack_40;
          (this->bias_data).d = iStack_3c;
          (this->bias_data).c = local_38;
          (this->bias_data).cstep = local_30;
        }
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + -1;
          UNLOCK();
          if (*local_68 == 0) {
            if (local_50 == (Allocator *)0x0) {
              if (local_70 != (void *)0x0) {
                free(local_70);
              }
            }
            else {
              (*local_50->_vptr_Allocator[3])();
            }
          }
        }
        if (((((this->bias_data).data != (void *)0x0) &&
             ((long)(this->bias_data).c * (this->bias_data).cstep != 0)) &&
            (Mat::create(&this->a_data,this->channels,4,(Allocator *)0x0),
            (this->a_data).data != (void *)0x0)) &&
           ((long)(this->a_data).c * (this->a_data).cstep != 0)) {
          Mat::create(&this->b_data,this->channels,4,(Allocator *)0x0);
          pvVar3 = (this->b_data).data;
          if ((pvVar3 != (void *)0x0) && ((long)(this->b_data).c * (this->b_data).cstep != 0)) {
            iVar1 = this->channels;
            if ((long)iVar1 < 1) {
              iVar11 = 0;
            }
            else {
              pvVar5 = (this->var_data).data;
              pvVar6 = (this->bias_data).data;
              pvVar7 = (this->slope_data).data;
              pvVar8 = (this->mean_data).data;
              pvVar9 = (this->a_data).data;
              iVar11 = 0;
              lVar10 = 0;
              do {
                fVar13 = SQRT(this->eps + *(float *)((long)pvVar5 + lVar10 * 4));
                uVar12 = -(uint)(fVar13 == 0.0);
                fVar13 = 1.0 / (float)(uVar12 & 0x38d1b717 | ~uVar12 & (uint)fVar13);
                *(float *)((long)pvVar9 + lVar10 * 4) =
                     *(float *)((long)pvVar6 + lVar10 * 4) -
                     *(float *)((long)pvVar8 + lVar10 * 4) * *(float *)((long)pvVar7 + lVar10 * 4) *
                     fVar13;
                *(float *)((long)pvVar3 + lVar10 * 4) =
                     fVar13 * *(float *)((long)pvVar7 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (iVar1 != lVar10);
            }
          }
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int BatchNorm::load_model(const ModelBin& mb)
{
    slope_data = mb.load(channels, 1);
    if (slope_data.empty())
        return -100;

    mean_data = mb.load(channels, 1);
    if (mean_data.empty())
        return -100;

    var_data = mb.load(channels, 1);
    if (var_data.empty())
        return -100;

    bias_data = mb.load(channels, 1);
    if (bias_data.empty())
        return -100;

    a_data.create(channels);
    if (a_data.empty())
        return -100;
    b_data.create(channels);
    if (b_data.empty())
        return -100;

    for (int i = 0; i < channels; i++)
    {
        float sqrt_var = static_cast<float>(sqrt(var_data[i] + eps));
        if (sqrt_var == 0.f)
            sqrt_var = 0.0001f; // sanitize divide by zero
        a_data[i] = bias_data[i] - slope_data[i] * mean_data[i] / sqrt_var;
        b_data[i] = slope_data[i] / sqrt_var;
    }

    return 0;
}